

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seed.cpp
# Opt level: O3

Seed jbcoin::randomSeed(void)

{
  undefined8 extraout_RDX;
  Seed *in_RDI;
  Seed SVar1;
  array<unsigned_char,_16UL> buffer;
  Slice local_30;
  uint8_t local_20 [16];
  
  crypto_prng();
  beast::rngfill<jbcoin::csprng_engine>(local_20,0x10,&crypto_prng::engine);
  local_30.size_ = 0x10;
  local_30.data_ = local_20;
  Seed::Seed(in_RDI,&local_30);
  beast::secure_erase<void>(local_20,0x10);
  SVar1.buf_._M_elems[8] = (char)extraout_RDX;
  SVar1.buf_._M_elems[9] = (char)((ulong)extraout_RDX >> 8);
  SVar1.buf_._M_elems[10] = (char)((ulong)extraout_RDX >> 0x10);
  SVar1.buf_._M_elems[0xb] = (char)((ulong)extraout_RDX >> 0x18);
  SVar1.buf_._M_elems[0xc] = (char)((ulong)extraout_RDX >> 0x20);
  SVar1.buf_._M_elems[0xd] = (char)((ulong)extraout_RDX >> 0x28);
  SVar1.buf_._M_elems[0xe] = (char)((ulong)extraout_RDX >> 0x30);
  SVar1.buf_._M_elems[0xf] = (char)((ulong)extraout_RDX >> 0x38);
  SVar1.buf_._M_elems._0_8_ = in_RDI;
  return (Seed)SVar1.buf_._M_elems;
}

Assistant:

Seed
randomSeed()
{
    std::array <std::uint8_t, 16> buffer;
    beast::rngfill (
        buffer.data(),
        buffer.size(),
        crypto_prng());
    Seed seed (makeSlice (buffer));
    beast::secure_erase(buffer.data(), buffer.size());
    return seed;
}